

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdGetBaseTapLeaf(void *handle,void *tree_handle,uint8_t *leaf_version,char **tapscript,
                     char **tap_leaf_hash)

{
  pointer *ppuVar1;
  TapBranch *this;
  TaprootScriptTree *this_00;
  bool bVar2;
  uint8_t uVar3;
  char *work_tap_leaf_hash;
  char *work_tapscript;
  char *local_a0;
  char *local_98;
  string local_88;
  Script local_68;
  
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_68.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_68._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_68);
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
  if (this == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
    this_00 = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
    if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this_00) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    if (tapscript != (char **)0x0) {
      cfd::core::TapBranch::GetScript(&local_68,(TapBranch *)this_00);
      cfd::core::Script::GetHex_abi_cxx11_(&local_88,&local_68);
      local_98 = cfd::capi::CreateString(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      cfd::core::Script::~Script(&local_68);
    }
    if (tap_leaf_hash != (char **)0x0) {
      cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&local_88,this_00);
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_68,(ByteData256 *)&local_88);
      local_a0 = cfd::capi::CreateString((string *)&local_68);
      if (local_68._vptr_Script != (_func_int **)ppuVar1) {
        operator_delete(local_68._vptr_Script);
      }
      if (local_88._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if (leaf_version != (uint8_t *)0x0) {
      uVar3 = cfd::core::TapBranch::GetLeafVersion((TapBranch *)this_00);
      *leaf_version = uVar3;
    }
    goto LAB_003f2cef;
  }
  bVar2 = cfd::core::TapBranch::HasTapLeaf(this);
  if (bVar2) {
    if (tapscript != (char **)0x0) {
      cfd::core::TapBranch::GetScript(&local_68,this);
      cfd::core::Script::GetHex_abi_cxx11_(&local_88,&local_68);
      local_98 = cfd::capi::CreateString(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      cfd::core::Script::~Script(&local_68);
    }
    if (leaf_version != (uint8_t *)0x0) {
      uVar3 = cfd::core::TapBranch::GetLeafVersion(this);
LAB_003f2c9d:
      *leaf_version = uVar3;
    }
  }
  else if (leaf_version != (uint8_t *)0x0) {
    uVar3 = '\0';
    goto LAB_003f2c9d;
  }
  if (tap_leaf_hash != (char **)0x0) {
    cfd::core::TapBranch::GetBaseHash((ByteData256 *)&local_88,this);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_68,(ByteData256 *)&local_88);
    local_a0 = cfd::capi::CreateString((string *)&local_68);
    if (local_68._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_68._vptr_Script);
    }
    if (local_88._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
LAB_003f2cef:
  if (tapscript != (char **)0x0) {
    *tapscript = local_98;
  }
  if (tap_leaf_hash != (char **)0x0) {
    *tap_leaf_hash = local_a0;
  }
  return 0;
}

Assistant:

int CfdGetBaseTapLeaf(
    void* handle, void* tree_handle, uint8_t* leaf_version, char** tapscript,
    char** tap_leaf_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_tap_leaf_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.HasTapLeaf()) {
        if (tapscript != nullptr) {
          work_tapscript = CreateString(branch.GetScript().GetHex());
        }
        if (leaf_version != nullptr) *leaf_version = branch.GetLeafVersion();
      } else {
        if (leaf_version != nullptr) *leaf_version = 0;
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(branch.GetBaseHash().GetHex());
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tapscript != nullptr) {
        work_tapscript = CreateString(tree.GetScript().GetHex());
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      if (leaf_version != nullptr) *leaf_version = tree.GetLeafVersion();
    }

    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (tap_leaf_hash != nullptr) *tap_leaf_hash = work_tap_leaf_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_tap_leaf_hash);
  return result;
}